

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vbroadcastf128(PDISASM pMyDisasm)

{
  char *pcVar1;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp != '\x01') {
LAB_0012adcf:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
      builtin_strncpy(pcVar1,"vbroadcastf32x4",0x10);
      if ((pMyDisasm->Reserved_).VEX.L == '\0') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      (pMyDisasm->Reserved_).EVEX.tupletype = '\n';
    }
    else {
      builtin_strncpy(pcVar1,"vbroadcastf64x2",0x10);
      if ((pMyDisasm->Reserved_).VEX.L == '\0') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      (pMyDisasm->Reserved_).EVEX.tupletype = '\t';
    }
  }
  else {
    if ((((pMyDisasm->Reserved_).VEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01'))
       || ((pMyDisasm->Reserved_).EVEX.W != '\0')) goto LAB_0012adcf;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vbroadcastf128",0xf);
    if ((pMyDisasm->Reserved_).VEX.L == '\0') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
  }
  vex_GE(pMyDisasm,0x6d,0x6d,0x6d,4,8,0x10);
  return;
}

Assistant:

void __bea_callspec__ vbroadcastf128(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vbroadcastf32x4");
        #endif
        if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
        if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE4;
        vex_GE(pMyDisasm, Arg2_m128_xmm, Arg2_m128_xmm, Arg2_m128_xmm, SSE_REG, AVX_REG, AVX512_REG);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vbroadcastf64x2");
        #endif
        if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
        if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE2;
        vex_GE(pMyDisasm, Arg2_m128_xmm, Arg2_m128_xmm, Arg2_m128_xmm, SSE_REG, AVX_REG, AVX512_REG);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vbroadcastf128");
        #endif
        if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
        if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
        vex_GE(pMyDisasm, Arg2_m128_xmm, Arg2_m128_xmm, Arg2_m128_xmm, SSE_REG, AVX_REG, AVX512_REG);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}